

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayAlter(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  pointer pCVar2;
  bool bVar3;
  int iVar4;
  AlterInfo *this_00;
  pointer this_01;
  UniqueConstraint *this_02;
  ColumnList *this_03;
  ColumnList *pCVar5;
  ColumnDefinition *pCVar6;
  LogicalType *__x;
  string *__x_00;
  Binder *pBVar7;
  type binder_00;
  DataTable *this_04;
  DataTableInfo *pDVar8;
  DatabaseInstance *pDVar9;
  IndexTypeSet *this_05;
  pointer *__ptr;
  pointer pLVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  element_type *peVar12;
  ColumnIndex *column_index;
  pointer pCVar13;
  ColumnListIterator CVar14;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> info;
  _Head_base<0UL,_duckdb::BoundIndex_*,_false> local_2a0;
  vector<unsigned_long,_true> column_ids;
  unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true> index_instance;
  undefined1 local_268 [16];
  TableCatalogEntry *local_258;
  optional_ptr<duckdb::IndexType,_true> index_type;
  shared_ptr<duckdb::Binder,_true> binder;
  CreateIndexInput input;
  vector<duckdb::ColumnIndex,_true> column_indexes;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  unbound_expressions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  vector<duckdb::LogicalType,_true> column_types;
  vector<duckdb::LogicalIndex,_true> logical_indexes;
  IndexBinder idx_binder;
  IndexStorageInfo index_storage_info;
  undefined4 extraout_var;
  
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(deserializer,0x65,"info");
  info.super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
  super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
       (__uniq_ptr_data<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true,_true>)0x0;
  iVar4 = (*(this->deserializer).super_Deserializer._vptr_Deserializer[10])(deserializer);
  if ((char)iVar4 != '\0') {
    (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
    ParseInfo::Deserialize((ParseInfo *)&index_storage_info,&deserializer->super_Deserializer);
    info.super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
    super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         index_storage_info.name._M_dataplus._M_p;
    (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  }
  (*(deserializer->super_Deserializer)._vptr_Deserializer[0xb])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  this_00 = (AlterInfo *)
            unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::operator->
                      (&info);
  bVar3 = AlterInfo::IsAddPrimaryKey(this_00);
  if (bVar3) {
    (*(deserializer->super_Deserializer)._vptr_Deserializer[2])
              (deserializer,0x66,"index_storage_info");
    (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
    IndexStorageInfo::Deserialize(&index_storage_info,&deserializer->super_Deserializer);
    (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
    (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
    ReplayIndexData(this->db,deserializer,&index_storage_info,this->deserialize_only);
    if (this->deserialize_only == false) {
      this_01 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                            *)(this_00 + 1));
      this_02 = Constraint::Cast<duckdb::UniqueConstraint>(this_01);
      idx_binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)
           Catalog::GetEntry<duckdb::TableCatalogEntry>
                     (this->catalog,this->context,&this_00->schema,&this_00->name,THROW_EXCEPTION,
                      (QueryErrorContext)0xffffffffffffffff);
      optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::TableCatalogEntry,_true> *)&idx_binder);
      local_258 = (TableCatalogEntry *)idx_binder.super_ExpressionBinder._vptr_ExpressionBinder;
      this_03 = TableCatalogEntry::GetColumns
                          ((TableCatalogEntry *)
                           idx_binder.super_ExpressionBinder._vptr_ExpressionBinder);
      Binder::CreateBinder
                ((Binder *)&binder,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,
                 REGULAR_BINDER);
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      column_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      column_names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      CVar14 = ColumnList::Logical(this_03);
      pCVar5 = CVar14.list;
      if (((undefined1  [16])CVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (((long)(pCVar5->columns).
                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     .
                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pCVar5->columns).
                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     .
                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      }
      else {
        idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(pCVar5->physical_columns).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pCVar5->physical_columns).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
      }
      idx_binder.super_ExpressionBinder.target_type.id_ = CVar14.physical;
      idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (((undefined1  [16])CVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        peVar12 = (element_type *)
                  (((long)(pCVar5->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar5->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      }
      else {
        peVar12 = (element_type *)
                  ((long)(pCVar5->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar5->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
      }
      if (((undefined1  [16])CVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (((long)(pCVar5->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pCVar5->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
      }
      else {
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)(pCVar5->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar5->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
      }
      idx_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)pCVar5;
      if ((peVar12 != (element_type *)0x0) ||
         (idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          p_Var11)) {
        do {
          do {
            pCVar6 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                               ((ColumnLogicalIteratorInternal *)&idx_binder);
            __x = ColumnDefinition::Type(pCVar6);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                      (&column_types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x)
            ;
            __x_00 = ColumnDefinition::Name_abi_cxx11_(pCVar6);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&column_names,__x_00);
            idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 ((long)&(idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->_vptr_ExtraTypeInfo + 1);
          } while (idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                   peVar12);
        } while ((idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != p_Var11) ||
                ((ColumnList *)idx_binder.super_ExpressionBinder._vptr_ExpressionBinder != pCVar5));
      }
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar7 = shared_ptr<duckdb::Binder,_true>::operator->(&binder);
      psVar1 = &idx_binder.super_ExpressionBinder.target_type.type_info_;
      idx_binder.super_ExpressionBinder.target_type.id_ = INVALID;
      idx_binder.super_ExpressionBinder.target_type.physical_type_ = ~INVALID;
      idx_binder.super_ExpressionBinder.target_type._2_6_ = 0;
      idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((ulong)idx_binder.super_ExpressionBinder.target_type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
           0xffffffffffffff00);
      idx_binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)psVar1;
      BindContext::AddBaseTable
                (&pBVar7->bind_context,0,(string *)&idx_binder,&column_names,&column_types,
                 &column_indexes,local_258,true);
      if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
          idx_binder.super_ExpressionBinder._vptr_ExpressionBinder != psVar1) {
        operator_delete(idx_binder.super_ExpressionBinder._vptr_ExpressionBinder);
      }
      binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
      IndexBinder::IndexBinder
                (&idx_binder,binder_00,this->context,
                 (optional_ptr<duckdb::TableCatalogEntry,_true>)0x0,
                 (optional_ptr<duckdb::CreateIndexInfo,_true>)0x0);
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      unbound_expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      UniqueConstraint::GetLogicalIndexes(&logical_indexes,this_02,this_03);
      if (logical_indexes.super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
          super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Vector_impl_data._M_start !=
          logical_indexes.super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
          super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pLVar10 = logical_indexes.
                  super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          pCVar6 = ColumnList::GetColumn(this_03,(LogicalIndex)pLVar10->index);
          ColumnDefinition::GetName_abi_cxx11_((string *)&input,pCVar6);
          make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string,std::__cxx11::string&>
                    ((duckdb *)&column_ids,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
                     &this_00->name);
          index_instance.
          super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
          super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl =
               (unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>)
               (unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>)
               column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          if (input.table_io_manager != (TableIOManager *)&input.constraint_type) {
            operator_delete(input.table_io_manager);
          }
          ExpressionBinder::Bind
                    ((ExpressionBinder *)&input,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&idx_binder,(LogicalType *)&index_instance,false);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&unbound_expressions,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&input);
          if (input.table_io_manager != (TableIOManager *)0x0) {
            (*(input.table_io_manager)->_vptr_TableIOManager[1])();
          }
          if (index_instance.
              super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
              super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>
              .super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl !=
              (__uniq_ptr_data<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true,_true>
               )0x0) {
            (**(code **)(*(long *)index_instance.
                                  super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>
                                  .super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl +
                        8))();
          }
          pLVar10 = pLVar10 + 1;
        } while (pLVar10 !=
                 logical_indexes.
                 super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      pCVar2 = column_indexes.
               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl
               .super__Vector_impl_data._M_finish;
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_start !=
          column_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
          super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pCVar13 = column_indexes.
                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          input.table_io_manager = (TableIOManager *)pCVar13->index;
          if (column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids,
                       (iterator)
                       column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_long *)&input);
          }
          else {
            *column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)input.table_io_manager;
            column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pCVar13 = pCVar13 + 1;
        } while (pCVar13 != pCVar2);
      }
      iVar4 = (*(local_258->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0x10])();
      this_04 = (DataTable *)CONCAT44(extraout_var,iVar4);
      pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this_04->info);
      input.table_io_manager =
           shared_ptr<duckdb::TableIOManager,_true>::operator*(&pDVar8->table_io_manager);
      input.db = this_04->db;
      input.options = &index_storage_info.options;
      input.constraint_type = PRIMARY;
      input.column_ids = &column_ids;
      input.unbound_expressions = &unbound_expressions;
      input.name = &index_storage_info.name;
      input.storage_info = &index_storage_info;
      pDVar9 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->context->db);
      this_05 = DBConfig::GetIndexTypes(&pDVar9->config);
      index_instance.super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>.
      _M_t.super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
      super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>)
           (unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>)local_268;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&index_instance,"ART","");
      index_type = IndexTypeSet::FindByName(this_05,(string *)&index_instance);
      if (index_instance.
          super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
          super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl !=
          (unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>)local_268) {
        operator_delete((void *)index_instance.
                                super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>
                                .super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl);
      }
      optional_ptr<duckdb::IndexType,_true>::CheckValid(&index_type);
      (*(index_type.ptr)->create_instance)((CreateIndexInput *)&index_instance);
      local_2a0._M_head_impl = (BoundIndex *)index_instance;
      index_instance.super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>.
      _M_t.super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
      super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>)
           (__uniq_ptr_data<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true,_true>
           )0x0;
      DataTable::AddIndex(this_04,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>
                                   *)&local_2a0);
      if ((_Head_base<0UL,_duckdb::BoundIndex_*,_false>)local_2a0._M_head_impl !=
          (_Head_base<0UL,_duckdb::BoundIndex_*,_false>)0x0) {
        (*((local_2a0._M_head_impl)->super_Index)._vptr_Index[1])();
      }
      local_2a0._M_head_impl = (BoundIndex *)0x0;
      Catalog::Alter(this->catalog,this->context,this_00);
      if (index_instance.
          super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
          super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true,_true>)
          0x0) {
        (**(code **)(*(long *)index_instance.
                              super_unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>
                              .super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl + 8))
                  ();
      }
      if (column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (logical_indexes.super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
          super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(logical_indexes.
                        super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                        super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&unbound_expressions);
      ExpressionBinder::~ExpressionBinder(&idx_binder.super_ExpressionBinder);
      ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                (&column_indexes.
                  super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&column_names);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&column_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      if (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    ::std::
    vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
    ::~vector(&index_storage_info.buffers.
               super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
             );
    ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
    ~vector(&index_storage_info.allocator_infos.
             super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
           );
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&index_storage_info.options._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)index_storage_info.name._M_dataplus._M_p != &index_storage_info.name.field_2) {
      operator_delete(index_storage_info.name._M_dataplus._M_p);
    }
  }
  else if (this->deserialize_only == false) {
    Catalog::Alter(this->catalog,this->context,this_00);
  }
  if (info.super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>.
      super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true,_true>)0x0) {
    (**(code **)(*(long *)info.
                          super_unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::ParseInfo_*,_std::default_delete<duckdb::ParseInfo>_>
                          .super__Head_base<0UL,_duckdb::ParseInfo_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayAlter() {
	auto info = deserializer.ReadProperty<unique_ptr<ParseInfo>>(101, "info");
	auto &alter_info = info->Cast<AlterInfo>();
	if (!alter_info.IsAddPrimaryKey()) {
		return ReplayWithoutIndex(context, catalog, alter_info, DeserializeOnly());
	}

	auto index_storage_info = deserializer.ReadProperty<IndexStorageInfo>(102, "index_storage_info");
	ReplayIndexData(db, deserializer, index_storage_info, DeserializeOnly());
	if (DeserializeOnly()) {
		return;
	}

	auto &table_info = alter_info.Cast<AlterTableInfo>();
	auto &constraint_info = table_info.Cast<AddConstraintInfo>();
	auto &unique_info = constraint_info.constraint->Cast<UniqueConstraint>();

	auto &table =
	    catalog.GetEntry<TableCatalogEntry>(context, table_info.schema, table_info.name).Cast<DuckTableEntry>();
	auto &column_list = table.GetColumns();

	// Add the table to the bind context to bind the parsed expressions.
	auto binder = Binder::CreateBinder(context);
	vector<LogicalType> column_types;
	vector<string> column_names;
	for (auto &col : column_list.Logical()) {
		column_types.push_back(col.Type());
		column_names.push_back(col.Name());
	}

	// Create a binder to bind the parsed expressions.
	vector<ColumnIndex> column_indexes;
	binder->bind_context.AddBaseTable(0, string(), column_names, column_types, column_indexes, table);
	IndexBinder idx_binder(*binder, context);

	// Bind the parsed expressions to create unbound expressions.
	vector<unique_ptr<Expression>> unbound_expressions;
	auto logical_indexes = unique_info.GetLogicalIndexes(column_list);
	for (const auto &logical_index : logical_indexes) {
		auto &col = column_list.GetColumn(logical_index);
		unique_ptr<ParsedExpression> parsed = make_uniq<ColumnRefExpression>(col.GetName(), table_info.name);
		unbound_expressions.push_back(idx_binder.Bind(parsed));
	}

	vector<column_t> column_ids;
	for (auto &column_index : column_indexes) {
		column_ids.push_back(column_index.GetPrimaryIndex());
	}

	auto &storage = table.GetStorage();
	CreateIndexInput input(TableIOManager::Get(storage), storage.db, IndexConstraintType::PRIMARY,
	                       index_storage_info.name, column_ids, unbound_expressions, index_storage_info,
	                       index_storage_info.options);

	auto index_type = context.db->config.GetIndexTypes().FindByName(ART::TYPE_NAME);
	auto index_instance = index_type->create_instance(input);
	storage.AddIndex(std::move(index_instance));

	catalog.Alter(context, alter_info);
}